

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

NonSemanticShaderDebugInfo100Instructions __thiscall
spvtools::opt::Instruction::GetShader100DebugOpcode(Instruction *this)

{
  uint32_t uVar1;
  NonSemanticShaderDebugInfo100Instructions NVar2;
  FeatureManager *pFVar3;
  
  if ((this->opcode_ == OpExtInst) &&
     (pFVar3 = IRContext::get_feature_mgr(this->context_),
     pFVar3->extinst_importid_Shader100DebugInfo_ != 0)) {
    uVar1 = GetSingleWordInOperand(this,0);
    pFVar3 = IRContext::get_feature_mgr(this->context_);
    if (uVar1 == pFVar3->extinst_importid_Shader100DebugInfo_) {
      NVar2 = GetSingleWordInOperand(this,1);
      if (NVar2 < NonSemanticShaderDebugInfo100InstructionsMax) {
        return NVar2;
      }
      return NonSemanticShaderDebugInfo100InstructionsMax;
    }
  }
  return NonSemanticShaderDebugInfo100InstructionsMax;
}

Assistant:

NonSemanticShaderDebugInfo100Instructions Instruction::GetShader100DebugOpcode()
    const {
  if (opcode() != spv::Op::OpExtInst) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  if (!context()->get_feature_mgr()->GetExtInstImportId_Shader100DebugInfo()) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  if (GetSingleWordInOperand(kExtInstSetIdInIdx) !=
      context()->get_feature_mgr()->GetExtInstImportId_Shader100DebugInfo()) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  uint32_t opcode = GetSingleWordInOperand(kExtInstInstructionInIdx);
  if (opcode >= NonSemanticShaderDebugInfo100InstructionsMax) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  return NonSemanticShaderDebugInfo100Instructions(opcode);
}